

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFUnitVector::addUnitsForDWOSection
          (DWARFUnitVector *this,DWARFContext *C,DWARFSection *DWOSection,
          DWARFSectionKind SectionKind,bool Lazy)

{
  StringRef SS;
  bool LE;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DWARFObject *Obj;
  DWARFDebugAbbrev *DA;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t extraout_RDX;
  DWARFObject *D;
  bool Lazy_local;
  DWARFSectionKind SectionKind_local;
  DWARFSection *DWOSection_local;
  DWARFContext *C_local;
  DWARFUnitVector *this_local;
  
  Obj = DWARFContext::getDWARFObj(C);
  DA = DWARFContext::getDebugAbbrevDWO(C);
  iVar1 = (*Obj->_vptr_DWARFObject[0x21])();
  iVar2 = (*Obj->_vptr_DWARFObject[0x1e])();
  iVar3 = (*Obj->_vptr_DWARFObject[0x1f])();
  SS.Data._4_4_ = extraout_var_01;
  SS.Data._0_4_ = iVar3;
  iVar3 = (*Obj->_vptr_DWARFObject[0x20])();
  iVar4 = (*Obj->_vptr_DWARFObject[0x23])();
  iVar5 = (*Obj->_vptr_DWARFObject[0x1d])();
  LE = DWARFContext::isLittleEndian(C);
  SS.Length = extraout_RDX;
  addUnitsImpl(this,C,Obj,DWOSection,DA,(DWARFSection *)CONCAT44(extraout_var,iVar1),
               (DWARFSection *)CONCAT44(extraout_var_00,iVar2),SS,
               (DWARFSection *)CONCAT44(extraout_var_02,iVar3),
               (DWARFSection *)CONCAT44(extraout_var_03,iVar4),
               (DWARFSection *)CONCAT44(extraout_var_04,iVar5),LE,true,Lazy,SectionKind);
  return;
}

Assistant:

void DWARFUnitVector::addUnitsForDWOSection(DWARFContext &C,
                                            const DWARFSection &DWOSection,
                                            DWARFSectionKind SectionKind,
                                            bool Lazy) {
  const DWARFObject &D = C.getDWARFObj();
  addUnitsImpl(C, D, DWOSection, C.getDebugAbbrevDWO(), &D.getRangesDWOSection(),
               &D.getLocDWOSection(), D.getStrDWOSection(),
               D.getStrOffsetsDWOSection(), &D.getAddrSection(),
               D.getLineDWOSection(), C.isLittleEndian(), true, Lazy,
               SectionKind);
}